

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O2

void __thiscall
pstore::error_or<std::__cxx11::string>::error_or<char_const(&)[2],void>
          (error_or<std::__cxx11::string> *this,char (*other) [2])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_9;
  
  this[0x20] = (error_or<std::__cxx11::string>)0x0;
  this_00 = value_storage_impl<pstore::error_or<std::__cxx11::string>&,std::__cxx11::string>
                      ((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this);
  std::__cxx11::string::string((string *)this_00,*other,&local_9);
  return;
}

Assistant:

explicit error_or (Other && other)
                : has_error_{false} {
            new (get_storage ()) storage_type (std::forward<Other> (other));
        }